

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

int png_icc_check_tag_table
              (png_const_structrp png_ptr,png_const_charp name,png_uint_32 profile_length,
              png_const_bytep profile)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  png_uint_32 tag_length;
  png_uint_32 tag_start;
  png_uint_32 tag_id;
  png_const_bytep tag;
  png_uint_32 itag;
  png_uint_32 tag_count;
  png_const_bytep profile_local;
  png_uint_32 profile_length_local;
  png_const_charp name_local;
  png_const_structrp png_ptr_local;
  
  bVar1 = profile[0x80];
  bVar2 = profile[0x81];
  bVar3 = profile[0x82];
  bVar4 = profile[0x83];
  _tag_start = profile + 0x84;
  tag._0_4_ = 0;
  while( true ) {
    if ((uint)bVar1 * 0x1000000 + (uint)bVar2 * 0x10000 + (uint)bVar3 * 0x100 + (uint)bVar4 <=
        (uint)tag) {
      return 1;
    }
    uVar5 = (uint)*_tag_start * 0x1000000 + (uint)_tag_start[1] * 0x10000 +
            (uint)_tag_start[2] * 0x100 + (uint)_tag_start[3];
    uVar6 = (uint)_tag_start[4] * 0x1000000 + (uint)_tag_start[5] * 0x10000 +
            (uint)_tag_start[6] * 0x100 + (uint)_tag_start[7];
    if ((profile_length < uVar6) ||
       (profile_length - uVar6 <
        (uint)_tag_start[8] * 0x1000000 + (uint)_tag_start[9] * 0x10000 +
        (uint)_tag_start[10] * 0x100 + (uint)_tag_start[0xb])) break;
    if ((uVar6 & 3) != 0) {
      png_icc_profile_error(png_ptr,name,(ulong)uVar5,"ICC profile tag start not a multiple of 4");
    }
    tag._0_4_ = (uint)tag + 1;
    _tag_start = _tag_start + 0xc;
  }
  iVar7 = png_icc_profile_error(png_ptr,name,(ulong)uVar5,"ICC profile tag outside profile");
  return iVar7;
}

Assistant:

int /* PRIVATE */
png_icc_check_tag_table(png_const_structrp png_ptr, png_const_charp name,
   png_uint_32 profile_length,
   png_const_bytep profile /* header plus whole tag table */)
{
   png_uint_32 tag_count = png_get_uint_32(profile+128);
   png_uint_32 itag;
   png_const_bytep tag = profile+132; /* The first tag */

   /* First scan all the tags in the table and add bits to the icc_info value
    * (temporarily in 'tags').
    */
   for (itag=0; itag < tag_count; ++itag, tag += 12)
   {
      png_uint_32 tag_id = png_get_uint_32(tag+0);
      png_uint_32 tag_start = png_get_uint_32(tag+4); /* must be aligned */
      png_uint_32 tag_length = png_get_uint_32(tag+8);/* not padded */

      /* The ICC specification does not exclude zero length tags, therefore the
       * start might actually be anywhere if there is no data, but this would be
       * a clear abuse of the intent of the standard so the start is checked for
       * being in range.  All defined tag types have an 8 byte header - a 4 byte
       * type signature then 0.
       */

      /* This is a hard error; potentially it can cause read outside the
       * profile.
       */
      if (tag_start > profile_length || tag_length > profile_length - tag_start)
         return png_icc_profile_error(png_ptr, name, tag_id,
             "ICC profile tag outside profile");

      if ((tag_start & 3) != 0)
      {
         /* CNHP730S.icc shipped with Microsoft Windows 64 violates this; it is
          * only a warning here because libpng does not care about the
          * alignment.
          */
         (void)png_icc_profile_error(png_ptr, name, tag_id,
             "ICC profile tag start not a multiple of 4");
      }
   }

   return 1; /* success, maybe with warnings */
}